

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

void __thiscall amrex::BARef::define(BARef *this,Box *bx)

{
  pointer *ppBVar1;
  int *piVar2;
  pointer pBVar3;
  pointer pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Box *pBVar8;
  size_type __n;
  long lVar9;
  Box *pBVar10;
  pointer pBVar11;
  Box *pBVar12;
  pointer pBVar13;
  
  pBVar13 = (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pBVar13 ==
      (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    __n = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::_M_check_len
                    ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)this,1,
                     "vector::_M_realloc_insert");
    pBVar3 = (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4 = (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar9 = (long)pBVar13 - (long)pBVar3 >> 2;
    if (__n == 0) {
      pBVar10 = (Box *)0x0;
    }
    else {
      pBVar10 = __gnu_cxx::new_allocator<amrex::Box>::allocate
                          ((new_allocator<amrex::Box> *)this,__n,(void *)0x0);
    }
    uVar5 = *(undefined8 *)(bx->smallend).vect;
    uVar6 = *(undefined8 *)((bx->smallend).vect + 2);
    uVar7 = *(undefined8 *)((bx->bigend).vect + 2);
    piVar2 = (pBVar10->bigend).vect + lVar9;
    *(undefined8 *)piVar2 = *(undefined8 *)(bx->bigend).vect;
    *(undefined8 *)(piVar2 + 2) = uVar7;
    piVar2 = (pBVar10->smallend).vect + lVar9;
    *(undefined8 *)piVar2 = uVar5;
    *(undefined8 *)(piVar2 + 2) = uVar6;
    pBVar12 = pBVar10;
    for (pBVar11 = pBVar3; pBVar11 != pBVar13; pBVar11 = pBVar11 + 1) {
      uVar5 = *(undefined8 *)(pBVar11->smallend).vect;
      uVar6 = *(undefined8 *)((pBVar11->smallend).vect + 2);
      uVar7 = *(undefined8 *)((pBVar11->bigend).vect + 2);
      *(undefined8 *)(pBVar12->bigend).vect = *(undefined8 *)(pBVar11->bigend).vect;
      *(undefined8 *)((pBVar12->bigend).vect + 2) = uVar7;
      *(undefined8 *)(pBVar12->smallend).vect = uVar5;
      *(undefined8 *)((pBVar12->smallend).vect + 2) = uVar6;
      pBVar12 = pBVar12 + 1;
    }
    for (; pBVar8 = pBVar12 + 1, pBVar4 != pBVar13; pBVar13 = pBVar13 + 1) {
      uVar5 = *(undefined8 *)(pBVar13->smallend).vect;
      uVar6 = *(undefined8 *)((pBVar13->smallend).vect + 2);
      uVar7 = *(undefined8 *)((pBVar13->bigend).vect + 2);
      *(undefined8 *)pBVar12[1].bigend.vect = *(undefined8 *)(pBVar13->bigend).vect;
      *(undefined8 *)(pBVar12[1].bigend.vect + 2) = uVar7;
      *(undefined8 *)(pBVar8->smallend).vect = uVar5;
      *(undefined8 *)(pBVar12[1].smallend.vect + 2) = uVar6;
      pBVar12 = pBVar8;
    }
    if (pBVar3 != (pointer)0x0) {
      operator_delete(pBVar3,(long)(this->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar3)
      ;
    }
    (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = pBVar10;
    (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = pBVar8;
    (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pBVar10 + __n;
    return;
  }
  uVar5 = *(undefined8 *)(bx->smallend).vect;
  uVar6 = *(undefined8 *)((bx->smallend).vect + 2);
  uVar7 = *(undefined8 *)((bx->bigend).vect + 2);
  *(undefined8 *)(pBVar13->bigend).vect = *(undefined8 *)(bx->bigend).vect;
  *(undefined8 *)((pBVar13->bigend).vect + 2) = uVar7;
  *(undefined8 *)(pBVar13->smallend).vect = uVar5;
  *(undefined8 *)((pBVar13->smallend).vect + 2) = uVar6;
  ppBVar1 = &(this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppBVar1 = *ppBVar1 + 1;
  return;
}

Assistant:

void
BARef::define (const Box& bx)
{
    BL_ASSERT(m_abox.size() == 0);
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(-1);
#endif
    m_abox.push_back(bx);
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(1);
#endif
}